

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv__getpwuid_r(uv_passwd_t *pwd,uid_t uid)

{
  undefined1 auVar1 [16];
  uv_passwd_t *puVar2;
  int iVar3;
  char *__buffer;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char *__dest;
  size_t size;
  passwd *result;
  uv_passwd_t *local_68;
  passwd pw;
  
  if (pwd == (uv_passwd_t *)0x0) {
    return -0x16;
  }
  size = 2000;
  local_68 = pwd;
  do {
    __buffer = (char *)uv__malloc(size);
    if (__buffer == (char *)0x0) goto LAB_00160635;
    do {
      iVar3 = getpwuid_r(uid,(passwd *)&pw,__buffer,size,(passwd **)&result);
    } while (iVar3 == 4);
    if ((iVar3 == 0) && (result != (passwd *)0x0)) goto LAB_00160581;
    uv__free(__buffer);
    size = size * 2;
  } while (iVar3 == 0x22);
  if (iVar3 == 0) {
    if (result == (passwd *)0x0) {
      iVar3 = -2;
    }
    else {
LAB_00160581:
      sVar4 = strlen(pw.pw_name);
      sVar5 = strlen(pw.pw_dir);
      sVar6 = strlen(pw.pw_shell);
      __dest = (char *)uv__malloc(sVar5 + sVar4 + sVar6 + 3);
      puVar2 = local_68;
      local_68->username = __dest;
      if (__dest == (char *)0x0) {
        uv__free(__buffer);
LAB_00160635:
        iVar3 = -0xc;
      }
      else {
        memcpy(__dest,pw.pw_name,sVar4 + 1);
        puVar2->homedir = puVar2->username + sVar4 + 1;
        memcpy(puVar2->username + sVar4 + 1,pw.pw_dir,sVar5 + 1);
        puVar2->shell = puVar2->homedir + sVar5 + 1;
        memcpy(puVar2->homedir + sVar5 + 1,pw.pw_shell,sVar6 + 1);
        auVar1._8_4_ = pw.pw_gid;
        auVar1._0_8_ = pw._16_8_ & 0xffffffff;
        auVar1._12_4_ = 0;
        puVar2->uid = pw._16_8_ & 0xffffffff;
        puVar2->gid = auVar1._8_8_;
        uv__free(__buffer);
        iVar3 = 0;
      }
    }
  }
  else {
    iVar3 = -iVar3;
  }
  return iVar3;
}

Assistant:

static int uv__getpwuid_r(uv_passwd_t *pwd, uid_t uid) {
  struct passwd pw;
  struct passwd* result;
  char* buf;
  size_t bufsize;
  size_t name_size;
  size_t homedir_size;
  size_t shell_size;
  int r;

  if (pwd == NULL)
    return UV_EINVAL;

  /* Calling sysconf(_SC_GETPW_R_SIZE_MAX) would get the suggested size, but it
   * is frequently 1024 or 4096, so we can just use that directly. The pwent
   * will not usually be large. */
  for (bufsize = 2000;; bufsize *= 2) {
    buf = uv__malloc(bufsize);

    if (buf == NULL)
      return UV_ENOMEM;

    do
      r = getpwuid_r(uid, &pw, buf, bufsize, &result);
    while (r == EINTR);

    if (r != 0 || result == NULL)
      uv__free(buf);

    if (r != ERANGE)
      break;
  }

  if (r != 0)
    return UV__ERR(r);

  if (result == NULL)
    return UV_ENOENT;

  /* Allocate memory for the username, shell, and home directory */
  name_size = strlen(pw.pw_name) + 1;
  homedir_size = strlen(pw.pw_dir) + 1;
  shell_size = strlen(pw.pw_shell) + 1;
  pwd->username = uv__malloc(name_size + homedir_size + shell_size);

  if (pwd->username == NULL) {
    uv__free(buf);
    return UV_ENOMEM;
  }

  /* Copy the username */
  memcpy(pwd->username, pw.pw_name, name_size);

  /* Copy the home directory */
  pwd->homedir = pwd->username + name_size;
  memcpy(pwd->homedir, pw.pw_dir, homedir_size);

  /* Copy the shell */
  pwd->shell = pwd->homedir + homedir_size;
  memcpy(pwd->shell, pw.pw_shell, shell_size);

  /* Copy the uid and gid */
  pwd->uid = pw.pw_uid;
  pwd->gid = pw.pw_gid;

  uv__free(buf);

  return 0;
}